

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O1

void evmap_signal_clear_(event_signal_map *ctx)

{
  long lVar1;
  
  if (ctx->entries != (void **)0x0) {
    if (0 < ctx->nentries) {
      lVar1 = 0;
      do {
        if (ctx->entries[lVar1] != (void *)0x0) {
          event_mm_free_(ctx->entries[lVar1]);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < ctx->nentries);
    }
    event_mm_free_(ctx->entries);
    ctx->entries = (void **)0x0;
  }
  ctx->nentries = 0;
  return;
}

Assistant:

void
evmap_signal_clear_(struct event_signal_map *ctx)
{
	if (ctx->entries != NULL) {
		int i;
		for (i = 0; i < ctx->nentries; ++i) {
			if (ctx->entries[i] != NULL)
				mm_free(ctx->entries[i]);
		}
		mm_free(ctx->entries);
		ctx->entries = NULL;
	}
	ctx->nentries = 0;
}